

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool bssl::add_outgoing(SSL *ssl,bool is_ccs,Array<unsigned_char> *data)

{
  DTLS1_STATE *pDVar1;
  bool bVar2;
  pointer pSVar3;
  unsigned_long *puVar4;
  DTLSOutgoingMessage *pDVar5;
  byte local_db;
  DTLSOutgoingMessage local_c0;
  undefined4 local_8c;
  unsigned_long local_88;
  size_t local_80 [3];
  undefined1 local_68 [8];
  DTLSOutgoingMessage msg;
  Array<unsigned_char> *data_local;
  bool is_ccs_local;
  SSL *ssl_local;
  
  if ((*(ushort *)ssl->d1 >> 1 & 1) != 0) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }
  if (!is_ccs) {
    if ((*(ushort *)ssl->d1 >> 3 & 1) != 0) {
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x24b);
      return false;
    }
    bVar2 = std::operator!=(&ssl->s3->hs,(nullptr_t)0x0);
    if (bVar2) {
      pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->
                         (&ssl->s3->hs);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&msg.acked.first_unmarked_byte_,data);
      bVar2 = SSLTranscript::Update(&pSVar3->transcript,stack0xffffffffffffffc8);
      if (!bVar2) {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x251);
        return false;
      }
    }
    ssl->d1->handshake_write_seq = ssl->d1->handshake_write_seq + 1;
    if (ssl->d1->handshake_write_seq == 0) {
      *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfff7 | 8;
    }
  }
  DTLSOutgoingMessage::DTLSOutgoingMessage((DTLSOutgoingMessage *)local_68);
  Array<unsigned_char>::operator=((Array<unsigned_char> *)local_68,data);
  msg.data.size_._0_2_ = DTLSWriteEpoch::epoch(&ssl->d1->write_epoch);
  local_db = 0;
  msg.data.size_._2_1_ = is_ccs;
  if (!is_ccs) {
    local_80[0] = DTLSOutgoingMessage::msg_len((DTLSOutgoingMessage *)local_68);
    local_88 = 1;
    puVar4 = std::max<unsigned_long>(local_80,&local_88);
    bVar2 = DTLSMessageBitmap::Init((DTLSMessageBitmap *)&msg.epoch,*puVar4);
    local_db = bVar2 ^ 0xff;
  }
  if ((local_db & 1) == 0) {
    pDVar1 = ssl->d1;
    DTLSOutgoingMessage::DTLSOutgoingMessage(&local_c0,(DTLSOutgoingMessage *)local_68);
    pDVar5 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::TryPushBack
                       (&pDVar1->outgoing_messages,&local_c0);
    DTLSOutgoingMessage::~DTLSOutgoingMessage(&local_c0);
    if (pDVar5 == (DTLSOutgoingMessage *)0x0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x26c,"bool bssl::add_outgoing(SSL *, bool, Array<uint8_t>)");
    }
    ssl_local._7_1_ = true;
  }
  else {
    ssl_local._7_1_ = false;
  }
  local_8c = 1;
  DTLSOutgoingMessage::~DTLSOutgoingMessage((DTLSOutgoingMessage *)local_68);
  return ssl_local._7_1_;
}

Assistant:

static bool add_outgoing(SSL *ssl, bool is_ccs, Array<uint8_t> data) {
  if (ssl->d1->outgoing_messages_complete) {
    // If we've begun writing a new flight, we received the peer flight. Discard
    // the timer and the our flight.
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!is_ccs) {
    if (ssl->d1->handshake_write_overflow) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return false;
    }
    // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript
    // on hs.
    if (ssl->s3->hs != NULL && !ssl->s3->hs->transcript.Update(data)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    ssl->d1->handshake_write_seq++;
    if (ssl->d1->handshake_write_seq == 0) {
      ssl->d1->handshake_write_overflow = true;
    }
  }

  DTLSOutgoingMessage msg;
  msg.data = std::move(data);
  msg.epoch = ssl->d1->write_epoch.epoch();
  msg.is_ccs = is_ccs;
  // Zero-length messages need 1 bit to track whether the peer has received the
  // message header. (Normally the message header is implicitly received when
  // any fragment of the message is received at all.)
  if (!is_ccs && !msg.acked.Init(std::max(msg.msg_len(), size_t{1}))) {
    return false;
  }

  // This should not fail if |SSL_MAX_HANDSHAKE_FLIGHT| was sized correctly.
  //
  // TODO(crbug.com/42290594): This can currently fail in DTLS 1.3. The caller
  // can configure how many tickets to send, up to kMaxTickets. Additionally, if
  // we send 0.5-RTT tickets in 0-RTT, we may even have tickets queued up with
  // the server flight.
  if (!ssl->d1->outgoing_messages.TryPushBack(std::move(msg))) {
    assert(false);
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}